

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_reopen(sqlite3_blob *pBlob,sqlite3_int64 iRow)

{
  uint uVar1;
  char *zFormat;
  long in_RDI;
  char *zErr;
  sqlite3 *db;
  Incrblob *p;
  int rc;
  sqlite3 *in_stack_ffffffffffffffc8;
  sqlite3 *db_00;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = sqlite3MisuseError(0);
  }
  else {
    db_00 = *(sqlite3 **)(in_RDI + 0x20);
    sqlite3_mutex_enter((sqlite3_mutex *)0x1393af);
    if ((*(long *)(in_RDI + 0x18) != 0) &&
       (uVar1 = blobSeekToRow(p,(sqlite3_int64)db,(char **)zErr), uVar1 != 0)) {
      zFormat = (char *)0x0;
      if (in_stack_ffffffffffffffc8 != (sqlite3 *)0x0) {
        zFormat = "%s";
      }
      sqlite3ErrorWithMsg(db_00,(int)(ulong)uVar1,zFormat,in_stack_ffffffffffffffc8);
      sqlite3DbFree(db_00,in_stack_ffffffffffffffc8);
    }
    local_4 = sqlite3ApiExit(in_stack_ffffffffffffffc8,0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x13943d);
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_blob_reopen(sqlite3_blob *pBlob, sqlite3_int64 iRow){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);

  if( p->pStmt==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    char *zErr;
    rc = blobSeekToRow(p, iRow, &zErr);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
      sqlite3DbFree(db, zErr);
    }
    assert( rc!=SQLITE_SCHEMA );
  }

  rc = sqlite3ApiExit(db, rc);
  assert( rc==SQLITE_OK || p->pStmt==0 );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}